

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.cpp
# Opt level: O2

string * toString(string *__return_storage_ptr__,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *strings)

{
  pointer pbVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)local_40);
  pbVar1 = (strings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (strings->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    std::__cxx11::string::string(local_40,(string *)pbVar2);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString(std::vector<std::string> strings) {
    std::string final = "";
    for (auto s: strings) {
        final += s;
    }
    return final;
}